

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUnitTest++.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_522a9::TestCheckArrayCloseWorksWithVectors::RunImpl
          (TestCheckArrayCloseWorksWithVectors *this)

{
  TestResults *results;
  int i;
  long lVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  float local_4c;
  vector<float,_std::allocator<float>_> a;
  TestDetails local_30;
  
  std::vector<float,_std::allocator<float>_>::vector(&a,4,(allocator_type *)&local_30);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    a.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    [lVar1] = (float)(int)lVar1;
  }
  ppTVar2 = UnitTest::CurrentTest::Results();
  results = *ppTVar2;
  local_4c = 0.0001;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_30,*ppTVar3,0x38);
  UnitTest::
  CheckArrayClose<std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,float>
            (results,&a,&a,
             (int)((ulong)((long)a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)a.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2),&local_4c,&local_30);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&a.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

TEST (CheckArrayCloseWorksWithVectors)
{
    std::vector< float > a(4);
    for (int i = 0; i < 4; ++i)
        a[i] = (float)i;

    CHECK_ARRAY_CLOSE(a, a, (int)a.size(), 0.0001f);
}